

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_utf_encode(nk_rune u,char *c,int clen)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = u;
  if (u - 0xd800 < 0x7ff) {
    uVar5 = 0xfffd;
  }
  uVar6 = (ulong)uVar5;
  if (0x10fffe < u) {
    uVar6 = 0xfffd;
  }
  uVar5 = (uint)uVar6;
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    uVar4 = uVar3 + 1;
  } while (nk_utfmax[uVar3 + 1] < uVar5);
  iVar1 = 0;
  if (uVar4 < 5 && (int)uVar4 <= clen) {
    if (uVar4 != 1) {
      lVar2 = (long)(int)uVar3;
      do {
        c[lVar2] = (byte)uVar6 & 0x3f | 0x80;
        uVar6 = uVar6 >> 6;
        uVar5 = (uint)uVar6;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    *c = ~nk_utfmask[uVar3 + 1] & (byte)uVar5 | nk_utfbyte[uVar3 + 1];
    iVar1 = (int)uVar4;
  }
  return iVar1;
}

Assistant:

NK_API int
nk_utf_encode(nk_rune u, char *c, int clen)
{
    int len, i;
    len = nk_utf_validate(&u, 0);
    if (clen < len || !len || len > NK_UTF_SIZE)
        return 0;

    for (i = len - 1; i != 0; --i) {
        c[i] = nk_utf_encode_byte(u, 0);
        u >>= 6;
    }
    c[0] = nk_utf_encode_byte(u, len);
    return len;
}